

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-semaphore.c
# Opt level: O2

void worker(void *arg)

{
  int64_t eval_b;
  int64_t eval_a;
  
  if (*(int *)((long)arg + 0x48) != 0) {
    uv_sleep();
  }
  uv_mutex_lock(arg);
  if ((long)*(int *)((long)arg + 0x4c) == 0) {
    uv_sem_post((long)arg + 0x28);
    *(undefined4 *)((long)arg + 0x4c) = 1;
    uv_mutex_unlock(arg);
    return;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-semaphore.c"
          ,0x2b,"c->posted","==","0",(long)*(int *)((long)arg + 0x4c),"==",0);
  abort();
}

Assistant:

static void worker(void* arg) {
  worker_config* c = arg;

  if (c->delay)
    uv_sleep(c->delay);

  uv_mutex_lock(&c->mutex);
  ASSERT_OK(c->posted);
  uv_sem_post(&c->sem);
  c->posted = 1;
  uv_mutex_unlock(&c->mutex);
}